

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

void PcodeCompile::matchSize
               (int4 j,OpTpl *op,bool inputonly,vector<OpTpl_*,_std::allocator<OpTpl_*>_> *ops)

{
  bool bVar1;
  int4 iVar2;
  VarnodeTpl *pVVar3;
  ConstTpl *size;
  VarnodeTpl *local_48;
  int local_3c;
  int4 inputsize;
  int4 i;
  VarnodeTpl *vt;
  VarnodeTpl *match;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *ops_local;
  bool inputonly_local;
  OpTpl *op_local;
  int4 j_local;
  
  vt = (VarnodeTpl *)0x0;
  if (j == -1) {
    local_48 = OpTpl::getOut(op);
  }
  else {
    local_48 = OpTpl::getIn(op,j);
  }
  if ((!inputonly) && (pVVar3 = OpTpl::getOut(op), pVVar3 != (VarnodeTpl *)0x0)) {
    pVVar3 = OpTpl::getOut(op);
    bVar1 = VarnodeTpl::isZeroSize(pVVar3);
    if (!bVar1) {
      vt = OpTpl::getOut(op);
    }
  }
  iVar2 = OpTpl::numInput(op);
  local_3c = 0;
  while ((local_3c < iVar2 && (vt == (VarnodeTpl *)0x0))) {
    pVVar3 = OpTpl::getIn(op,local_3c);
    bVar1 = VarnodeTpl::isZeroSize(pVVar3);
    if (!bVar1) {
      vt = OpTpl::getIn(op,local_3c);
    }
    local_3c = local_3c + 1;
  }
  if (vt != (VarnodeTpl *)0x0) {
    size = VarnodeTpl::getSize(vt);
    force_size(local_48,size,ops);
  }
  return;
}

Assistant:

void PcodeCompile::matchSize(int4 j,OpTpl *op,bool inputonly,const vector<OpTpl *> &ops)

{				// Find something to fill in zero size varnode
				// j is the slot we are trying to fill (-1=output)
				// Don't check output for non-zero if inputonly is true
  VarnodeTpl *match = (VarnodeTpl *)0;
  VarnodeTpl *vt;
  int4 i,inputsize;

  vt = (j==-1) ? op->getOut() : op->getIn(j);
  if (!inputonly) {
    if (op->getOut() != (VarnodeTpl *)0)
      if (!op->getOut()->isZeroSize())
	match = op->getOut();
  }
  inputsize = op->numInput();
  for(i=0;i<inputsize;++i) {
    if (match != (VarnodeTpl *)0) break;
    if (op->getIn(i)->isZeroSize()) continue;
    match = op->getIn(i);
  }
  if (match != (VarnodeTpl *)0)
    force_size(vt,match->getSize(),ops);
}